

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.cpp
# Opt level: O3

void lzham::lzham_free(lzham_malloc_context context,void *p)

{
  if (p != (void *)0x0) {
    if (context == (lzham_malloc_context)0x0) {
      lzham_assert("context",
                   "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamdecomp/lzham_mem.cpp"
                   ,400);
    }
    if (((ulong)p & 0xf) != 0) {
      lzham_assert("lzham_free: bad ptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamdecomp/lzham_mem.cpp"
                   ,0x98);
      return;
    }
    if (*context != 0x5749abcd) {
      lzham_assert("pContext->m_sig == malloc_context::cSig",
                   "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamdecomp/lzham_mem.cpp"
                   ,0x19a);
    }
    if ((p < (void *)((long)context + 0x34U)) ||
       ((void *)((long)context + (ulong)*(uint *)((long)context + 4) + 0x34) <= p)) {
      (*(code *)g_pRealloc)(p,0,0,1,g_pUser_data);
      return;
    }
  }
  return;
}

Assistant:

void lzham_free(lzham_malloc_context context, void* p)
   {
      if (!p)
         return;
      
      LZHAM_VERIFY(context);

      if (reinterpret_cast<ptr_bits_t>(p) & (LZHAM_MIN_ALLOC_ALIGNMENT - 1))
      {
         lzham_mem_error(context, "lzham_free: bad ptr");
         return;
      }
      
      malloc_context *pContext = static_cast<malloc_context *>(context);
      
      LZHAM_VERIFY(pContext->m_sig == malloc_context::cSig);

#if LZHAM_MEM_STATS
      size_t cur_size = lzham_msize(context, p);
      pContext->update_total_allocated(-1, -static_cast<int64>(cur_size));
#endif
      
      if (!pContext->ptr_is_in_arena(p))
      {
         (*g_pRealloc)(p, 0, NULL, true, g_pUser_data);
      }
   }